

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::setMinimumPDFVersion(QPDFWriter *this,PDFVersion *v)

{
  int local_3c;
  undefined1 local_38 [4];
  int extension_level;
  string version;
  PDFVersion *v_local;
  QPDFWriter *this_local;
  
  version.field_2._8_8_ = v;
  std::__cxx11::string::string((string *)local_38);
  PDFVersion::getVersion((PDFVersion *)version.field_2._8_8_,(string *)local_38,&local_3c);
  setMinimumPDFVersion(this,(string *)local_38,local_3c);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
QPDFWriter::setMinimumPDFVersion(PDFVersion const& v)
{
    std::string version;
    int extension_level;
    v.getVersion(version, extension_level);
    setMinimumPDFVersion(version, extension_level);
}